

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O1

void VP8PutSignedBits(VP8BitWriter *bw,int value,int nb_bits)

{
  uint uVar1;
  bool bVar2;
  
  VP8PutBitUniform(bw,(uint)(value != 0));
  if (value != 0) {
    if (value < 0) {
      uVar1 = 1 << ((byte)nb_bits & 0x1f);
      do {
        VP8PutBitUniform(bw,uVar1 & value * -2 + 1U);
        bVar2 = 1 < uVar1;
        uVar1 = uVar1 >> 1;
      } while (bVar2);
    }
    else {
      uVar1 = 1 << ((byte)nb_bits & 0x1f);
      do {
        VP8PutBitUniform(bw,uVar1 & value * 2);
        bVar2 = 1 < uVar1;
        uVar1 = uVar1 >> 1;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void VP8PutSignedBits(VP8BitWriter* const bw, int value, int nb_bits) {
  if (!VP8PutBitUniform(bw, value != 0)) return;
  if (value < 0) {
    VP8PutBits(bw, ((-value) << 1) | 1, nb_bits + 1);
  } else {
    VP8PutBits(bw, value << 1, nb_bits + 1);
  }
}